

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::visitEnumDecl(CheckerVisitor *this,EnumDecl *enm)

{
  SymbolInfo *pSVar1;
  VarScope *pVVar2;
  Chunk *pCVar3;
  ValueRef *pVVar4;
  mapped_type *ppVVar5;
  ulong uVar6;
  long lVar7;
  EnumConst *c;
  EnumConst *pEVar8;
  SQChar *local_38;
  
  if (enm->_global == true) {
    putIntoGlobalNamesMap
              (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                     *)declaredGlobals_abi_cxx11_,DI_GLOBAL_NAME_REDEF,enm->_id,(Node *)enm);
  }
  pCVar3 = Arena::findChunk(this->arena,0x18);
  pSVar1 = (SymbolInfo *)pCVar3->_ptr;
  pCVar3->_ptr = (uint8_t *)(pSVar1 + 1);
  (pSVar1->declarator).x = (Id *)0x0;
  pSVar1->kind = SK_ENUM;
  pSVar1->declared = true;
  pSVar1->used = false;
  pSVar1->usedAfterAssign = false;
  pSVar1->ownedScope = (VarScope *)0x0;
  pVVar4 = makeValueRef(this,pSVar1);
  pVVar4->state = VRS_DECLARED;
  pVVar4->expression = (Expr *)0x0;
  (pSVar1->declarator).e = enm;
  pVVar2 = this->currentScope;
  pSVar1->ownedScope = pVVar2;
  pSVar1->used = enm->_global;
  local_38 = enm->_id;
  ppVVar5 = std::__detail::
            _Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pVVar2->symbols,&local_38);
  *ppVVar5 = pVVar4;
  uVar6 = (ulong)(enm->_consts)._size;
  if (uVar6 != 0) {
    pEVar8 = (enm->_consts)._vals;
    lVar7 = uVar6 << 4;
    do {
      pCVar3 = Arena::findChunk(this->arena,0x18);
      pSVar1 = (SymbolInfo *)pCVar3->_ptr;
      pCVar3->_ptr = (uint8_t *)(pSVar1 + 1);
      (pSVar1->declarator).x = (Id *)0x0;
      pSVar1->kind = SK_ENUM_CONST;
      pSVar1->declared = true;
      pSVar1->used = false;
      pSVar1->usedAfterAssign = false;
      pSVar1->ownedScope = (VarScope *)0x0;
      pVVar4 = makeValueRef(this,pSVar1);
      pVVar4->state = VRS_INITIALIZED;
      pVVar4->expression = (Expr *)pEVar8->val;
      (pSVar1->declarator).ec = pEVar8;
      pSVar1->ownedScope = this->currentScope;
      pSVar1->used = enm->_global;
      local_38 = enumFqn(this->arena,enm->_id,pEVar8->id);
      ppVVar5 = std::__detail::
                _Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->currentScope->symbols,&local_38);
      *ppVVar5 = pVVar4;
      Node::visit<SQCompilation::CheckerVisitor>((Node *)pEVar8->val,this);
      pEVar8 = pEVar8 + 1;
      lVar7 = lVar7 + -0x10;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void CheckerVisitor::visitEnumDecl(EnumDecl *enm) {

  if (enm->isGlobal()) {
    storeGlobalDeclaration(enm->name(), enm);
  }

  SymbolInfo *info = makeSymbolInfo(SK_ENUM);
  ValueRef *ev = makeValueRef(info);
  ev->state = VRS_DECLARED;
  ev->expression = nullptr;
  info->declarator.e = enm;
  info->ownedScope = currentScope;
  info->used = enm->isGlobal();
  declareSymbol(enm->name(), ev);

  for (auto &c : enm->consts()) {
    SymbolInfo *constInfo = makeSymbolInfo(SK_ENUM_CONST);
    ValueRef *cv = makeValueRef(constInfo);
    cv->state = VRS_INITIALIZED;
    cv->expression = c.val;
    constInfo->declarator.ec = &c;
    constInfo->ownedScope = currentScope;
    constInfo->used = enm->isGlobal();

    const SQChar *fqn = enumFqn(arena, enm->name(), c.id);
    declareSymbol(fqn, cv);

    c.val->visit(this);
  }
}